

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

bool __thiscall
wasm::OptimizeInstructions::optimizeSubsequentStructSet
          (OptimizeInstructions *this,StructNew *new_,StructSet *set,Index refLocalIndex)

{
  size_t *this_00;
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  Drop *left;
  Block *pBVar5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar6;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar7;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar8;
  uint uVar9;
  undefined1 local_328 [8];
  EffectAnalyzer setValueEffects;
  EffectAnalyzer operandEffects;
  Builder local_40;
  Builder builder;
  
  if ((((new_->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id == 1) ||
      ((set->super_SpecificExpression<(wasm::Expression::Id)62>).super_Expression.type.id == 1)) ||
     ((new_->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements == 0)) {
    return false;
  }
  uVar9 = set->index;
  builder.wasm = (Module *)set;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_328,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,set->value);
  if (setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    psVar8 = &setValueEffects.localsRead;
    do {
      psVar7 = psVar8;
      psVar6 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      uVar1 = *(uint *)&(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      psVar8 = psVar6;
      if (uVar1 < refLocalIndex) {
        psVar8 = psVar7;
      }
      setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (&(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
           [uVar1 < refLocalIndex];
    } while ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x0);
    if (psVar8 != &setValueEffects.localsRead) {
      if (uVar1 < refLocalIndex) {
        psVar6 = psVar7;
      }
      if (*(uint *)&(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right <= refLocalIndex
         ) goto LAB_007ef112;
    }
  }
  if (setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    psVar8 = &setValueEffects.localsWritten;
    do {
      psVar7 = psVar8;
      psVar6 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      uVar1 = *(uint *)&(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      psVar8 = psVar6;
      if (uVar1 < refLocalIndex) {
        psVar8 = psVar7;
      }
      setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (&(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
           [uVar1 < refLocalIndex];
    } while ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x0);
    if (psVar8 != &setValueEffects.localsWritten) {
      if (uVar1 < refLocalIndex) {
        psVar6 = psVar7;
      }
      if (*(uint *)&(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right <= refLocalIndex
         ) goto LAB_007ef112;
    }
  }
  this_00 = &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (ulong)uVar9;
  do {
    sVar3 = operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    uVar9 = uVar9 + 1;
    uVar2 = (new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (uVar2 <= uVar9) {
      local_40.wasm =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
      if (uVar2 <= operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
      goto LAB_007ef262;
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,local_40.wasm,
                 (new_->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count]);
      bVar4 = EffectAnalyzer::hasNonTrapSideEffects
                        ((EffectAnalyzer *)
                         &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
      if (bVar4) {
        EffectAnalyzer::~EffectAnalyzer
                  ((EffectAnalyzer *)
                   &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                  );
LAB_007ef17f:
        if ((new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= sVar3) {
LAB_007ef262:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        left = Builder::makeDrop(&local_40,
                                 (new_->operands).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 .data[sVar3]);
        pBVar5 = Builder::makeSequence
                           (&local_40,(Expression *)left,
                            (Expression *)
                            ((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        if ((new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= sVar3) goto LAB_007ef262;
      }
      else {
        if (operandEffects.readsMemory == false) {
          EffectAnalyzer::~EffectAnalyzer
                    ((EffectAnalyzer *)
                     &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
        }
        else {
          EffectAnalyzer::~EffectAnalyzer
                    ((EffectAnalyzer *)
                     &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
          if (setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_
              == '\0') goto LAB_007ef17f;
        }
        if ((new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= sVar3) goto LAB_007ef262;
        pBVar5 = (Block *)((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
      }
      (new_->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data[sVar3] = (Expression *)pBVar5;
      bVar4 = true;
      goto LAB_007ef1fd;
    }
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)this_00,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,
               (new_->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar9]);
    bVar4 = EffectAnalyzer::invalidates((EffectAnalyzer *)this_00,(EffectAnalyzer *)local_328);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&operandEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&operandEffects.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&operandEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&operandEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&operandEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&operandEffects.features);
    if (operandEffects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 operandEffects.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
  } while (!bVar4);
LAB_007ef112:
  bVar4 = false;
LAB_007ef1fd:
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&setValueEffects.features);
  if (setValueEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               setValueEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  return bVar4;
}

Assistant:

bool optimizeSubsequentStructSet(StructNew* new_,
                                   StructSet* set,
                                   Index refLocalIndex) {
    // Leave unreachable code for DCE, to avoid updating types here.
    if (new_->type == Type::unreachable || set->type == Type::unreachable) {
      return false;
    }

    if (new_->isWithDefault()) {
      // Ignore a new_default for now. If the fields are defaultable then we
      // could add them, in principle, but that might increase code size.
      return false;
    }

    auto index = set->index;
    auto& operands = new_->operands;

    // Check for effects that prevent us moving the struct.set's value (X' in
    // the function comment) into its new position in the struct.new. First, it
    // must be ok to move it past the local.set (otherwise, it might read from
    // memory using that local, and depend on the struct.new having already
    // occurred; or, if it writes to that local, then it would cross another
    // write).
    auto setValueEffects = effects(set->value);
    if (setValueEffects.localsRead.count(refLocalIndex) ||
        setValueEffects.localsWritten.count(refLocalIndex)) {
      return false;
    }

    // We must move the set's value past indexes greater than it (Y and Z in
    // the example in the comment on this function).
    // TODO When this function is called repeatedly in a sequence this can
    //      become quadratic - perhaps we should memoize (though, struct sizes
    //      tend to not be ridiculously large).
    for (Index i = index + 1; i < operands.size(); i++) {
      auto operandEffects = effects(operands[i]);
      if (operandEffects.invalidates(setValueEffects)) {
        // TODO: we could use locals to reorder everything
        return false;
      }
    }

    Builder builder(*getModule());

    // See if we need to keep the old value.
    if (effects(operands[index]).hasUnremovableSideEffects()) {
      operands[index] =
        builder.makeSequence(builder.makeDrop(operands[index]), set->value);
    } else {
      operands[index] = set->value;
    }

    return true;
  }